

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cc
# Opt level: O1

EventLoop * __thiscall tt::net::EventLoopThreadPool::getNextLoop(EventLoopThreadPool *this)

{
  pointer ppEVar1;
  EventLoop *pEVar2;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  if (this->started_ != false) {
    ppEVar1 = (this->loops_).
              super__Vector_base<tt::net::EventLoop_*,_std::allocator<tt::net::EventLoop_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar1 ==
        (this->loops_).
        super__Vector_base<tt::net::EventLoop_*,_std::allocator<tt::net::EventLoop_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pEVar2 = this->baseLoop_;
    }
    else {
      pEVar2 = ppEVar1[this->next_];
      this->next_ = (this->next_ + 1) % this->numThreads_;
    }
    return pEVar2;
  }
  __assert_fail("started_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoopThreadPool.cc"
                ,0x1e,"EventLoop *tt::net::EventLoopThreadPool::getNextLoop()");
}

Assistant:

EventLoop *EventLoopThreadPool::getNextLoop() {
  baseLoop_->assertInLoopThread();
  assert(started_);
  EventLoop *loop = baseLoop_;
  if (!loops_.empty()) {
    loop = loops_[next_];
    next_ = (next_ + 1) % numThreads_;
  }
  return loop;
}